

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

UINT16 TPMU_PUBLIC_PARMS_Marshal
                 (TPMU_PUBLIC_PARMS *source,BYTE **buffer,INT32 *size,UINT32 selector)

{
  UINT32 selector_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMU_PUBLIC_PARMS *source_local;
  
  switch(selector) {
  case 1:
    source_local._6_2_ = TPMS_RSA_PARMS_Marshal(&source->rsaDetail,buffer,size);
    break;
  default:
    source_local._6_2_ = 0;
    break;
  case 8:
    source_local._6_2_ =
         TPMT_KEYEDHASH_SCHEME_Marshal(&(source->keyedHashDetail).scheme,buffer,size);
    break;
  case 0x23:
    source_local._6_2_ = TPMS_ECC_PARMS_Marshal(&source->eccDetail,buffer,size);
    break;
  case 0x25:
    source_local._6_2_ =
         TPMT_SYM_DEF_OBJECT_Marshal((TPMT_SYM_DEF_OBJECT *)&source->keyedHashDetail,buffer,size);
  }
  return source_local._6_2_;
}

Assistant:

UINT16
TPMU_PUBLIC_PARMS_Marshal(TPMU_PUBLIC_PARMS *source, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_KEYEDHASH
        case TPM_ALG_KEYEDHASH:
            return TPMS_KEYEDHASH_PARMS_Marshal((TPMS_KEYEDHASH_PARMS *)&(source->keyedHashDetail), buffer, size);
#endif // ALG_KEYEDHASH
#if         ALG_SYMCIPHER
        case TPM_ALG_SYMCIPHER:
            return TPMS_SYMCIPHER_PARMS_Marshal((TPMS_SYMCIPHER_PARMS *)&(source->symDetail), buffer, size);
#endif // ALG_SYMCIPHER
#if         ALG_RSA
        case TPM_ALG_RSA:
            return TPMS_RSA_PARMS_Marshal((TPMS_RSA_PARMS *)&(source->rsaDetail), buffer, size);
#endif // ALG_RSA
#if         ALG_ECC
        case TPM_ALG_ECC:
            return TPMS_ECC_PARMS_Marshal((TPMS_ECC_PARMS *)&(source->eccDetail), buffer, size);
#endif // ALG_ECC
    }
    return 0;
}